

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::bitrv2(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double yi;
  double yr;
  double xi;
  double xr;
  int nm;
  int nh;
  int m;
  int l;
  int k1;
  int k;
  int j1;
  int j;
  double *a_local;
  int *ip_local;
  int n_local;
  
  m = 1;
  for (l = n >> 2; 8 < l; l = l >> 2) {
    m = m << 1;
  }
  iVar4 = n >> 1;
  iVar5 = m * 4;
  if (l == 8) {
    for (k = 0; k < m; k = k + 1) {
      for (j = 0; j < k; j = j + 1) {
        iVar6 = j * 4 + ip[m + k] * 2;
        iVar7 = k * 4 + ip[m + j] * 2;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 1];
        a[iVar6] = a[iVar7];
        a[iVar6 + 1] = dVar3;
        a[iVar7] = dVar1;
        a[iVar7 + 1] = dVar2;
        iVar6 = iVar5 + iVar6;
        iVar7 = m * 8 + iVar7;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 1];
        a[iVar6] = a[iVar7];
        a[iVar6 + 1] = dVar3;
        a[iVar7] = dVar1;
        a[iVar7 + 1] = dVar2;
        iVar6 = iVar5 + iVar6;
        iVar7 = iVar7 + m * -4;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 1];
        a[iVar6] = a[iVar7];
        a[iVar6 + 1] = dVar3;
        a[iVar7] = dVar1;
        a[iVar7 + 1] = dVar2;
        iVar6 = iVar5 + iVar6;
        iVar7 = m * 8 + iVar7;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 1];
        a[iVar6] = a[iVar7];
        a[iVar6 + 1] = dVar3;
        a[iVar7] = dVar1;
        a[iVar7 + 1] = dVar2;
        iVar6 = iVar4 + iVar6;
        iVar8 = iVar7 + 2;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 3];
        a[iVar6] = a[iVar8];
        a[iVar6 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar7 + 3] = dVar2;
        iVar6 = iVar6 + m * -4;
        iVar8 = iVar8 + m * -8;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar6] = a[iVar8];
        a[iVar6 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar6 = iVar6 + m * -4;
        iVar8 = iVar5 + iVar8;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar6] = a[iVar8];
        a[iVar6 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar6 = iVar6 + m * -4;
        iVar8 = iVar8 + m * -8;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar6] = a[iVar8];
        a[iVar6 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar6 + 2;
        iVar8 = iVar4 + iVar8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar6 + 3];
        dVar3 = a[iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[iVar6 + 3] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar5 + iVar7;
        iVar8 = m * 8 + iVar8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[iVar7 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar5 + iVar7;
        iVar8 = iVar8 + m * -4;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[iVar7 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar5 + iVar7;
        iVar8 = m * 8 + iVar8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[iVar7 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar7 - iVar4;
        iVar6 = iVar8 + -2;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar8 + -1];
        a[iVar7] = a[iVar6];
        a[iVar7 + 1] = dVar3;
        a[iVar6] = dVar1;
        a[iVar8 + -1] = dVar2;
        iVar7 = iVar7 + m * -4;
        iVar6 = iVar6 + m * -8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar7] = a[iVar6];
        a[iVar7 + 1] = dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = dVar2;
        iVar7 = iVar7 + m * -4;
        iVar6 = iVar5 + iVar6;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar7] = a[iVar6];
        a[iVar7 + 1] = dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = dVar2;
        iVar7 = iVar7 + m * -4;
        iVar6 = iVar6 + m * -8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar7] = a[iVar6];
        a[iVar7 + 1] = dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = dVar2;
      }
      iVar7 = k * 4 + ip[m + k] * 2;
      iVar6 = iVar7 + 2;
      iVar8 = iVar4 + iVar7;
      dVar1 = a[iVar6];
      dVar2 = a[iVar7 + 3];
      dVar3 = a[iVar8 + 1];
      a[iVar6] = a[iVar8];
      a[iVar7 + 3] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
      iVar6 = iVar5 + iVar6;
      iVar8 = m * 8 + iVar8;
      dVar1 = a[iVar6];
      dVar2 = a[iVar6 + 1];
      dVar3 = a[iVar8 + 1];
      a[iVar6] = a[iVar8];
      a[iVar6 + 1] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
      iVar6 = iVar5 + iVar6;
      iVar8 = iVar8 + m * -4;
      dVar1 = a[iVar6];
      dVar2 = a[iVar6 + 1];
      dVar3 = a[iVar8 + 1];
      a[iVar6] = a[iVar8];
      a[iVar6 + 1] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
      iVar7 = iVar6 + -2;
      iVar8 = iVar8 - iVar4;
      dVar1 = a[iVar7];
      dVar2 = a[iVar6 + -1];
      dVar3 = a[iVar8 + 1];
      a[iVar7] = a[iVar8];
      a[iVar6 + -1] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
      iVar7 = iVar4 + 2 + iVar7;
      iVar8 = iVar4 + 2 + iVar8;
      dVar1 = a[iVar7];
      dVar2 = a[iVar7 + 1];
      dVar3 = a[iVar8 + 1];
      a[iVar7] = a[iVar8];
      a[iVar7 + 1] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
      iVar7 = iVar7 - (iVar4 + m * -4);
      iVar8 = m * 8 + -2 + iVar8;
      dVar1 = a[iVar7];
      dVar2 = a[iVar7 + 1];
      dVar3 = a[iVar8 + 1];
      a[iVar7] = a[iVar8];
      a[iVar7 + 1] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
    }
  }
  else {
    for (k = 0; k < m; k = k + 1) {
      for (j = 0; j < k; j = j + 1) {
        iVar6 = j * 4 + ip[m + k];
        iVar7 = k * 4 + ip[m + j];
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 1];
        a[iVar6] = a[iVar7];
        a[iVar6 + 1] = dVar3;
        a[iVar7] = dVar1;
        a[iVar7 + 1] = dVar2;
        iVar6 = iVar5 + iVar6;
        iVar7 = iVar5 + iVar7;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 1];
        a[iVar6] = a[iVar7];
        a[iVar6 + 1] = dVar3;
        a[iVar7] = dVar1;
        a[iVar7 + 1] = dVar2;
        iVar6 = iVar4 + iVar6;
        iVar8 = iVar7 + 2;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar7 + 3];
        a[iVar6] = a[iVar8];
        a[iVar6 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar7 + 3] = dVar2;
        iVar6 = iVar6 + m * -4;
        iVar8 = iVar8 + m * -4;
        dVar1 = a[iVar6];
        dVar2 = a[iVar6 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar6] = a[iVar8];
        a[iVar6 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar6 + 2;
        iVar8 = iVar4 + iVar8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar6 + 3];
        dVar3 = a[iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[iVar6 + 3] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar5 + iVar7;
        iVar8 = iVar5 + iVar8;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[iVar7 + 1] = dVar3;
        a[iVar8] = dVar1;
        a[iVar8 + 1] = dVar2;
        iVar7 = iVar7 - iVar4;
        iVar6 = iVar8 + -2;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar8 + -1];
        a[iVar7] = a[iVar6];
        a[iVar7 + 1] = dVar3;
        a[iVar6] = dVar1;
        a[iVar8 + -1] = dVar2;
        iVar7 = iVar7 + m * -4;
        iVar6 = iVar6 + m * -4;
        dVar1 = a[iVar7];
        dVar2 = a[iVar7 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar7] = a[iVar6];
        a[iVar7 + 1] = dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = dVar2;
      }
      iVar7 = k * 4 + ip[m + k];
      iVar6 = iVar7 + 2;
      iVar8 = iVar4 + iVar7;
      dVar1 = a[iVar6];
      dVar2 = a[iVar7 + 3];
      dVar3 = a[iVar8 + 1];
      a[iVar6] = a[iVar8];
      a[iVar7 + 3] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
      iVar6 = iVar5 + iVar6;
      iVar8 = iVar5 + iVar8;
      dVar1 = a[iVar6];
      dVar2 = a[iVar6 + 1];
      dVar3 = a[iVar8 + 1];
      a[iVar6] = a[iVar8];
      a[iVar6 + 1] = dVar3;
      a[iVar8] = dVar1;
      a[iVar8 + 1] = dVar2;
    }
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a) {
  int j, j1, k, k1, l, m, nh, nm;
  double xr, xi, yr, yi;

  m = 1;
  for (l = n >> 2; l > 8; l >>= 2) {
    m <<= 1;
  }
  nh = n >> 1;
  nm = 4 * m;
  if (l == 8) {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + 2 * ip[m + k];
        k1 = 4 * k + 2 * ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + 2 * ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += 2 * nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 -= nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= 2;
      k1 -= nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nh + 2;
      k1 += nh + 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= nh - nm;
      k1 += 2 * nm - 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  } else {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + ip[m + k];
        k1 = 4 * k + ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  }
}